

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void hermite_ss_compute(int order,double *xtab,double *weight)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double local_70;
  double dp2;
  double p1;
  ulong local_58;
  double local_50;
  double local_48;
  int local_3c;
  double local_38;
  
  local_50 = (double)order;
  local_48 = tgamma(local_50);
  local_48 = local_48 * 1.7724538509055159;
  local_3c = order + -1;
  dVar7 = ldexp(1.0,local_3c);
  local_48 = local_48 / dVar7;
  dVar8 = pow(local_50 + local_50 + 1.0,0.16666666666666666);
  uVar1 = (long)(order + 1) / 2;
  dVar7 = -1.85575 / dVar8;
  p1 = dVar8 * dVar8 * dVar8 + dVar7;
  uVar5 = 0;
  iVar6 = local_3c;
  local_58 = (ulong)(uint)order;
  uVar2 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar2 = uVar5;
  }
  do {
    if (uVar2 == uVar5) {
      uVar1 = (long)((ulong)(uint)((int)local_58 >> 0x1f) << 0x20 | local_58 & 0xffffffff) / 2;
      uVar2 = uVar1 & 0xffffffff;
      lVar3 = 0;
      pdVar4 = xtab;
      if ((int)uVar1 < 1) {
        uVar2 = 0;
      }
      for (; -lVar3 != uVar2; lVar3 = lVar3 + -1) {
        dVar7 = *pdVar4;
        *pdVar4 = xtab[local_3c + lVar3];
        xtab[local_3c + lVar3] = dVar7;
        pdVar4 = pdVar4 + 1;
      }
      return;
    }
    switch(uVar5 & 0xffffffff) {
    case 0:
      local_38 = p1;
      break;
    case 1:
      dVar8 = pow(local_50,0.426);
      local_38 = (dVar8 * -1.14) / dVar7 + dVar7;
      break;
    case 2:
      local_38 = *xtab * -0.86;
      dVar7 = dVar7 * 1.86;
      goto LAB_001e2101;
    case 3:
      local_38 = xtab[1] * -0.91;
      dVar7 = dVar7 * 1.91;
LAB_001e2101:
      local_38 = dVar7 + local_38;
      break;
    default:
      local_38 = (dVar7 + dVar7) - xtab[uVar5 - 2];
    }
    hermite_ss_root(&local_38,(int)local_58,&local_70,&dp2);
    xtab[uVar5] = local_38;
    weight[uVar5] = (local_48 / local_70) / dp2;
    xtab[iVar6] = -local_38;
    weight[iVar6] = weight[uVar5];
    uVar5 = uVar5 + 1;
    iVar6 = iVar6 + -1;
    dVar7 = local_38;
  } while( true );
}

Assistant:

void hermite_ss_compute ( int order, double xtab[], double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_SS_COMPUTE computes a Gauss-Hermite quadrature rule.
//
//  Discussion:
//
//    The abscissas are the zeros of the N-th order Hermite polynomial.
//
//    The integral:
//
//      Integral ( -oo < X < +oo ) exp ( - X*X ) * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    19 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order of the formula to be computed.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double cc;
  double dp2;
  int i;
  double p1;
  const double r8_pi = 3.141592653589793;
  double s;
  double x;

  cc = sqrt ( r8_pi ) * tgamma ( double( order ) ) 
    / pow ( 2.0, order - 1 );

  s = pow ( 2.0 * double( order ) + 1.0, 1.0 / 6.0 );

  for ( i = 0; i < ( order + 1 ) / 2; i++ )
  {
    if ( i == 0 )
    {
      x = s * s * s - 1.85575 / s;
    }
    else if ( i == 1 )
    {
      x = x - 1.14 * pow ( double( order ), 0.426 ) / x;
    }
    else if ( i == 2 )
    {
      x = 1.86 * x - 0.86 * xtab[0];
    }
    else if ( i == 3 )
    {
      x = 1.91 * x - 0.91 * xtab[1];
    }
    else
    {
      x = 2.0 * x - xtab[i-2];
    }

    hermite_ss_root ( &x, order, &dp2, &p1 );

    xtab[i] = x;
    weight[i] = ( cc / dp2 ) / p1;

    xtab[order-i-1] = -x;
    weight[order-i-1] = weight[i];
  }
//
//  Reverse the order of the values.
//
  for ( i = 0; i < ( order / 2 ); i++ )
  {
    x               = xtab[i];
    xtab[i]         = xtab[order-1-i];
    xtab[order-1-i] = x;
  }

  return;
}